

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_partial_usingDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              char *dictStart,int dictSize)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ushort *puVar13;
  ushort *__src;
  ushort *puVar14;
  ulong uVar15;
  size_t sVar16;
  size_t dictSize_00;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  long lVar21;
  BYTE *d_2;
  BYTE *d_3;
  ulong uVar22;
  char *pcVar23;
  BYTE *s;
  int local_70;
  int local_38;
  
  if (dictSize == 0) {
    iVar9 = LZ4_decompress_safe_partial(source,dest,compressedSize,targetOutputSize,dstCapacity);
    return iVar9;
  }
  dictSize_00 = (size_t)dictSize;
  if (dictStart + dictSize_00 == dest) {
    if (targetOutputSize < dstCapacity) {
      dstCapacity = targetOutputSize;
    }
    uVar12 = (ulong)(uint)dstCapacity;
    local_38 = (int)dest;
    if (dictSize < 0xffff) {
      if (dstCapacity < 0 || source == (char *)0x0) {
        return -1;
      }
      if (dstCapacity != 0) {
        if (compressedSize == 0) {
          return -1;
        }
        pcVar20 = dest + -dictSize_00;
        pbVar1 = (byte *)(source + compressedSize);
        pcVar2 = dest + uVar12;
        pcVar23 = dest + (uVar12 - 0x20);
        puVar14 = (ushort *)source;
        while( true ) {
          __src = (ushort *)((long)puVar14 + 1);
          bVar3 = (byte)*puVar14;
          uVar12 = (ulong)(uint)(bVar3 >> 4);
          if (bVar3 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) || (pcVar23 < dest))
          goto LAB_002abc26;
          uVar6 = *(undefined8 *)((long)puVar14 + 9);
          *(undefined8 *)dest = *(undefined8 *)__src;
          *(undefined8 *)(dest + 8) = uVar6;
          pcVar18 = dest + uVar12;
          uVar22 = (ulong)(bVar3 & 0xf);
          puVar14 = (ushort *)((long)__src + uVar12);
          __src = puVar14 + 1;
          uVar7 = *puVar14;
          pcVar19 = pcVar18 + -(ulong)uVar7;
          if ((uVar22 == 0xf) || ((uVar7 < 8 || (pcVar19 < pcVar20)))) {
LAB_002abd43:
            if ((int)uVar22 == 0xf) {
              lVar10 = 0;
              puVar14 = __src;
              do {
                __src = (ushort *)((long)puVar14 + 1);
                if (pbVar1 + -4 < __src) goto LAB_002abeb4;
                uVar8 = *puVar14;
                lVar10 = lVar10 + (ulong)(byte)uVar8;
                puVar14 = __src;
              } while ((ulong)(byte)uVar8 == 0xff);
              uVar22 = lVar10 + 0xf;
              if ((lVar10 == -1) || (CARRY8((ulong)pcVar18,uVar22))) goto LAB_002abeb4;
            }
            if (pcVar19 < pcVar20) goto LAB_002abeb4;
            uVar22 = uVar22 + 4;
            dest = pcVar18 + uVar22;
            puVar14 = __src;
            if (pcVar2 + -0xc < dest) {
              uVar12 = (long)pcVar2 - (long)pcVar18;
              if (uVar22 < (ulong)((long)pcVar2 - (long)pcVar18)) {
                uVar12 = uVar22;
              }
              dest = pcVar18 + uVar12;
              if (pcVar18 < pcVar19 + uVar12) {
                for (; pcVar18 < dest; pcVar18 = pcVar18 + 1) {
                  cVar4 = *pcVar19;
                  pcVar19 = pcVar19 + 1;
                  *pcVar18 = cVar4;
                }
              }
              else {
                memcpy(pcVar18,pcVar19,uVar12);
              }
              pcVar18 = pcVar2;
              if (dest == pcVar2) {
LAB_002abea7:
                return (int)pcVar18 - local_38;
              }
            }
            else {
              if (uVar7 < 8) {
                pcVar18[0] = '\0';
                pcVar18[1] = '\0';
                pcVar18[2] = '\0';
                pcVar18[3] = '\0';
                *pcVar18 = *pcVar19;
                pcVar18[1] = pcVar19[1];
                pcVar18[2] = pcVar19[2];
                pcVar18[3] = pcVar19[3];
                uVar5 = inc32table[uVar7];
                *(undefined4 *)(pcVar18 + 4) = *(undefined4 *)(pcVar19 + uVar5);
                pcVar19 = pcVar19 + ((ulong)uVar5 - (long)dec64table[uVar7]);
              }
              else {
                *(undefined8 *)pcVar18 = *(undefined8 *)pcVar19;
                pcVar19 = pcVar19 + 8;
              }
              *(undefined8 *)(pcVar18 + 8) = *(undefined8 *)pcVar19;
              if (0x10 < uVar22) {
                pcVar18 = pcVar18 + 0x10;
                do {
                  pcVar19 = pcVar19 + 8;
                  *(undefined8 *)pcVar18 = *(undefined8 *)pcVar19;
                  pcVar18 = pcVar18 + 8;
                } while (pcVar18 < dest);
              }
            }
          }
          else {
            *(undefined8 *)pcVar18 = *(undefined8 *)pcVar19;
            *(undefined8 *)(pcVar18 + 8) = *(undefined8 *)(pcVar19 + 8);
            *(undefined2 *)(pcVar18 + 0x10) = *(undefined2 *)(pcVar19 + 0x10);
            dest = pcVar18 + uVar22 + 4;
            puVar14 = __src;
          }
        }
        if (pbVar1 + -0xf <= __src) goto LAB_002abeb4;
        puVar14 = puVar14 + 1;
        lVar10 = 0;
        puVar13 = __src;
        do {
          __src = (ushort *)((long)puVar13 + 1);
          if (pbVar1 + -0xf < __src) goto LAB_002abeb4;
          uVar7 = *puVar13;
          lVar10 = lVar10 + (ulong)(byte)uVar7;
          puVar14 = (ushort *)((long)puVar14 + 1);
          puVar13 = __src;
        } while ((ulong)(byte)uVar7 == 0xff);
        if (((lVar10 == -1) || (uVar12 = lVar10 + 0xf, CARRY8((ulong)dest,uVar12))) ||
           ((ulong)-(long)puVar14 < uVar12)) goto LAB_002abeb4;
LAB_002abc26:
        pcVar18 = dest + uVar12;
        if ((pcVar2 + -0xc < pcVar18) ||
           (puVar14 = (ushort *)((long)__src + uVar12), pbVar1 + -8 < puVar14)) {
          pcVar19 = pcVar18;
          if (pbVar1 < (byte *)((long)__src + uVar12)) {
            pcVar19 = dest + ((long)pbVar1 - (long)__src);
            uVar12 = (long)pbVar1 - (long)__src;
          }
          sVar16 = (long)pcVar2 - (long)dest;
          if (pcVar19 <= pcVar2) {
            sVar16 = uVar12;
          }
          memmove(dest,__src,sVar16);
          pcVar18 = dest + sVar16;
          if ((pcVar2 <= pcVar19) ||
             (puVar14 = (ushort *)((long)__src + sVar16), pbVar1 + -2 <= puVar14))
          goto LAB_002abea7;
        }
        else {
          do {
            *(undefined8 *)dest = *(undefined8 *)__src;
            dest = dest + 8;
            __src = __src + 4;
          } while (dest < pcVar18);
        }
        uVar7 = *puVar14;
        __src = puVar14 + 1;
        pcVar19 = pcVar18 + -(ulong)uVar7;
        uVar22 = (ulong)(bVar3 & 0xf);
        goto LAB_002abd43;
      }
    }
    else {
      if (dstCapacity < 0 || source == (char *)0x0) {
        return -1;
      }
      if (dstCapacity != 0) {
        if (compressedSize == 0) {
          return -1;
        }
        pbVar1 = (byte *)(source + compressedSize);
        pcVar2 = dest + uVar12;
        uVar22 = 0;
        puVar14 = (ushort *)source;
LAB_002ab837:
        do {
          pcVar23 = dest + uVar22;
          __src = (ushort *)((long)puVar14 + 1);
          bVar3 = (byte)*puVar14;
          uVar11 = (ulong)(uint)(bVar3 >> 4);
          if (bVar3 >> 4 == 0xf) {
            if (pbVar1 + -0xf <= __src) {
LAB_002abeb4:
              local_70 = (int)source;
              return ~(uint)__src + local_70;
            }
            puVar14 = puVar14 + 1;
            lVar10 = 0;
            puVar13 = __src;
            do {
              __src = (ushort *)((long)puVar13 + 1);
              if (pbVar1 + -0xf < __src) goto LAB_002abeb4;
              uVar7 = *puVar13;
              lVar10 = lVar10 + (ulong)(byte)uVar7;
              puVar14 = (ushort *)((long)puVar14 + 1);
              puVar13 = __src;
            } while ((ulong)(byte)uVar7 == 0xff);
            if (((lVar10 == -1) || (uVar11 = lVar10 + 0xf, CARRY8((ulong)pcVar23,uVar11))) ||
               ((ulong)-(long)puVar14 < uVar11)) goto LAB_002abeb4;
LAB_002ab8ab:
            lVar10 = uVar11 + uVar22;
            pcVar20 = dest + lVar10;
            if ((pcVar2 + -0xc < pcVar20) ||
               (puVar14 = (ushort *)((long)__src + uVar11), pbVar1 + -8 < puVar14)) {
              if (pbVar1 < (byte *)((long)__src + uVar11)) {
                pcVar20 = pcVar23 + ((long)pbVar1 - (long)__src);
                uVar11 = (long)pbVar1 - (long)__src;
              }
              sVar16 = uVar12 - uVar22;
              if (pcVar20 <= pcVar2) {
                sVar16 = uVar11;
              }
              memmove(pcVar23,__src,sVar16);
              lVar10 = uVar22 + sVar16;
              if ((pcVar2 <= pcVar20) ||
                 (puVar14 = (ushort *)((long)__src + sVar16), pbVar1 + -2 <= puVar14)) {
                pcVar23 = dest + lVar10;
                goto LAB_002abe9c;
              }
            }
            else {
              do {
                *(undefined8 *)pcVar23 = *(undefined8 *)__src;
                pcVar23 = pcVar23 + 8;
                __src = __src + 4;
              } while (pcVar23 < pcVar20);
            }
            uVar7 = *puVar14;
            __src = puVar14 + 1;
            lVar17 = lVar10 - (ulong)uVar7;
            uVar15 = (ulong)(bVar3 & 0xf);
          }
          else {
            if ((source + (long)compressedSize + -0x10 <= __src) ||
               (dest + (uVar12 - 0x20) < pcVar23)) goto LAB_002ab8ab;
            uVar6 = *(undefined8 *)((long)puVar14 + 9);
            *(undefined8 *)pcVar23 = *(undefined8 *)__src;
            *(undefined8 *)(pcVar23 + 8) = uVar6;
            lVar10 = uVar22 + uVar11;
            uVar15 = (ulong)(bVar3 & 0xf);
            puVar14 = (ushort *)((long)__src + uVar11);
            __src = puVar14 + 1;
            uVar7 = *puVar14;
            lVar17 = lVar10 - (ulong)uVar7;
            if (7 < uVar7 && uVar15 != 0xf) {
              *(undefined8 *)(dest + lVar10) = *(undefined8 *)(dest + lVar17);
              *(undefined8 *)(dest + lVar10 + 8) = *(undefined8 *)(dest + lVar17 + 8);
              *(undefined2 *)(dest + lVar10 + 0x10) = *(undefined2 *)(dest + lVar17 + 0x10);
              uVar22 = lVar10 + uVar15 + 4;
              puVar14 = __src;
              goto LAB_002ab837;
            }
          }
          pcVar20 = dest + lVar10;
          if ((int)uVar15 == 0xf) {
            lVar21 = 0;
            puVar14 = __src;
            do {
              __src = (ushort *)((long)puVar14 + 1);
              if (pbVar1 + -4 < __src) goto LAB_002abeb4;
              uVar8 = *puVar14;
              lVar21 = lVar21 + (ulong)(byte)uVar8;
              puVar14 = __src;
            } while ((ulong)(byte)uVar8 == 0xff);
            uVar15 = lVar21 + 0xf;
            if ((lVar21 == -1) || (CARRY8((ulong)pcVar20,uVar15))) goto LAB_002abeb4;
          }
          if (lVar17 < -0x10000) goto LAB_002abeb4;
          pcVar18 = dest + lVar17;
          uVar15 = uVar15 + 4;
          uVar22 = uVar15 + lVar10;
          puVar14 = __src;
          if (pcVar2 + -0xc < dest + uVar22) {
            uVar11 = uVar12 - lVar10;
            if (uVar15 < uVar12 - lVar10) {
              uVar11 = uVar15;
            }
            uVar22 = lVar10 + uVar11;
            pcVar23 = dest + uVar22;
            if (pcVar20 < pcVar18 + uVar11) {
              for (; pcVar20 < pcVar23; pcVar20 = pcVar20 + 1) {
                cVar4 = *pcVar18;
                pcVar18 = pcVar18 + 1;
                *pcVar20 = cVar4;
              }
            }
            else {
              memcpy(pcVar20,pcVar18,uVar11);
            }
            if (uVar22 == uVar12) {
LAB_002abe9c:
              return (int)pcVar23 - local_38;
            }
          }
          else {
            if (uVar7 < 8) {
              pcVar20[0] = '\0';
              pcVar20[1] = '\0';
              pcVar20[2] = '\0';
              pcVar20[3] = '\0';
              *pcVar20 = *pcVar18;
              pcVar20[1] = pcVar18[1];
              pcVar20[2] = pcVar18[2];
              pcVar20[3] = pcVar18[3];
              uVar5 = inc32table[uVar7];
              *(undefined4 *)(pcVar20 + 4) = *(undefined4 *)(pcVar18 + uVar5);
              pcVar18 = pcVar18 + ((ulong)uVar5 - (long)dec64table[uVar7]);
            }
            else {
              *(undefined8 *)pcVar20 = *(undefined8 *)pcVar18;
              pcVar18 = pcVar18 + 8;
            }
            *(undefined8 *)(pcVar20 + 8) = *(undefined8 *)pcVar18;
            if (0x10 < uVar15) {
              pcVar20 = pcVar20 + 0x10;
              do {
                pcVar18 = pcVar18 + 8;
                *(undefined8 *)pcVar20 = *(undefined8 *)pcVar18;
                pcVar20 = pcVar20 + 8;
              } while (pcVar20 < dest + uVar22);
            }
          }
        } while( true );
      }
    }
    iVar9 = 0;
  }
  else {
    iVar9 = LZ4_decompress_safe_partial_forceExtDict
                      (source,dest,compressedSize,targetOutputSize,dstCapacity,dictStart,dictSize_00
                      );
  }
  return iVar9;
}

Assistant:

int LZ4_decompress_safe_partial_usingDict(const char* source, char* dest, int compressedSize, int targetOutputSize, int dstCapacity, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe_partial(source, dest, compressedSize, targetOutputSize, dstCapacity);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_partial_withPrefix64k(source, dest, compressedSize, targetOutputSize, dstCapacity);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_partial_withSmallPrefix(source, dest, compressedSize, targetOutputSize, dstCapacity, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_partial_forceExtDict(source, dest, compressedSize, targetOutputSize, dstCapacity, dictStart, (size_t)dictSize);
}